

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expression.cpp
# Opt level: O2

void __thiscall duckdb::Expression::~Expression(Expression *this)

{
  (this->super_BaseExpression)._vptr_BaseExpression = (_func_int **)&PTR__Expression_0178d148;
  ::std::unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
  ~unique_ptr(&(this->verification_stats).
               super_unique_ptr<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>
             );
  LogicalType::~LogicalType(&this->return_type);
  BaseExpression::~BaseExpression(&this->super_BaseExpression);
  return;
}

Assistant:

Expression::~Expression() {
}